

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_xmi_midiout.cpp
# Opt level: O0

void __thiscall XMISong::XMISong(XMISong *this,FileReader *reader,EMidiDevice type,char *args)

{
  undefined1 auVar1 [16];
  int iVar2;
  long lVar3;
  BYTE *pBVar4;
  undefined4 extraout_var;
  ulong uVar5;
  TrackInfo *pTVar6;
  char *args_local;
  EMidiDevice type_local;
  FileReader *reader_local;
  XMISong *this_local;
  
  MIDIStreamer::MIDIStreamer(&this->super_MIDIStreamer,type,args);
  (this->super_MIDIStreamer).super_MusInfo._vptr_MusInfo = (_func_int **)&PTR__XMISong_009f0788;
  this->MusHeader = (BYTE *)0x0;
  this->Songs = (TrackInfo *)0x0;
  NoteOffQueue::NoteOffQueue(&this->NoteOffs);
  lVar3 = FileReader::GetLength(reader);
  this->SongLen = (int)lVar3;
  pBVar4 = (BYTE *)operator_new__((long)this->SongLen);
  this->MusHeader = pBVar4;
  iVar2 = (*(reader->super_FileReaderBase)._vptr_FileReaderBase[2])
                    (reader,this->MusHeader,(long)this->SongLen);
  if (CONCAT44(extraout_var,iVar2) == (long)this->SongLen) {
    iVar2 = FindXMIDforms(this,this->MusHeader,this->SongLen,(TrackInfo *)0x0);
    this->NumSongs = iVar2;
    if (this->NumSongs != 0) {
      (this->super_MIDIStreamer).Division = 0x3c;
      (this->super_MIDIStreamer).InitialTempo = 500000;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (long)this->NumSongs;
      uVar5 = SUB168(auVar1 * ZEXT816(0x80),0);
      if (SUB168(auVar1 * ZEXT816(0x80),8) != 0) {
        uVar5 = 0xffffffffffffffff;
      }
      pTVar6 = (TrackInfo *)operator_new__(uVar5);
      this->Songs = pTVar6;
      memset(this->Songs,0,(long)this->NumSongs << 7);
      FindXMIDforms(this,this->MusHeader,this->SongLen,this->Songs);
      this->CurrSong = this->Songs;
      DPrintf(4,"XMI song count: %d\n",(ulong)(uint)this->NumSongs);
    }
  }
  return;
}

Assistant:

XMISong::XMISong (FileReader &reader, EMidiDevice type, const char *args)
: MIDIStreamer(type, args), MusHeader(0), Songs(0)
{
#ifdef _WIN32
	if (ExitEvent == NULL)
	{
		return;
	}
#endif
	SongLen = reader.GetLength();
	MusHeader = new BYTE[SongLen];
	if (reader.Read(MusHeader, SongLen) != SongLen)
		return;

	// Find all the songs in this file.
	NumSongs = FindXMIDforms(MusHeader, SongLen, NULL);
	if (NumSongs == 0)
	{
		return;
	}

	// XMIDI files are played with a constant 120 Hz clock rate. While the
	// song may contain tempo events, these are vestigial remnants from the
	// original MIDI file that were not removed by the converter and should
	// be ignored.
	//
	// We can use any combination of Division and Tempo values that work out
	// to be 120 Hz.
	Division = 60;
	InitialTempo = 500000;

	Songs = new TrackInfo[NumSongs];
	memset(Songs, 0, sizeof(*Songs) * NumSongs);
	FindXMIDforms(MusHeader, SongLen, Songs);
	CurrSong = Songs;
	DPrintf(DMSG_SPAMMY, "XMI song count: %d\n", NumSongs);
}